

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_operators.hpp
# Opt level: O2

Scalar Disa::dot_product<double,0ul,0ul>
                 (Vector_Dense<double,_0UL> *vector_0,Vector_Dense<double,_0UL> *vector_1)

{
  source_location *psVar1;
  ostream *poVar2;
  source_location *location;
  double *pdVar3;
  Scalar SVar4;
  string sStack_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar1 = (source_location *)
           (vector_0->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  location = (source_location *)
             (vector_0->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  pdVar3 = (vector_1->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((long)location - (long)psVar1 ==
      (long)(vector_1->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish - (long)pdVar3) {
    SVar4 = 0.0;
    for (; psVar1 != location; psVar1 = psVar1 + 1) {
      SVar4 = SVar4 + (double)psVar1->_M_impl * *pdVar3;
      pdVar3 = pdVar3 + 1;
    }
    return SVar4;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_00172448;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::__cxx11::to_string
            (&local_e8,
             (long)(vector_0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector_0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_c8,"Incompatible vector sizes, ",&local_e8);
  std::operator+(&local_a8,&local_c8," vs. ");
  std::__cxx11::to_string
            (&sStack_108,
             (long)(vector_1->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector_1->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_88,&local_a8,&sStack_108);
  std::operator+(&local_68,&local_88,".");
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

constexpr Scalar dot_product(const Vector_Dense<_type, _size_0>& vector_0,
                             const Vector_Dense<_type, _size_1>& vector_1) {
  ASSERT_DEBUG(vector_0.size() == vector_1.size(), "Incompatible vector sizes, " + std::to_string(vector_0.size()) +
                                                   " vs. " + std::to_string(vector_1.size()) + ".");
  return std::inner_product(vector_0.begin(), vector_0.end(), vector_1.begin(), 0.0);
}